

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O3

int mod2sparse_count_col(mod2sparse *m,int col)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int extraout_EAX;
  FILE *pFVar8;
  mod2entry *pmVar9;
  mod2entry *extraout_RAX;
  mod2sparse *pmVar10;
  void *pvVar11;
  mod2sparse *__ptr;
  mod2sparse *r;
  mod2sparse *pmVar12;
  long lVar13;
  long lVar14;
  mod2entry *pmVar15;
  undefined8 *puVar16;
  int *piVar17;
  mod2sparse *in_RCX;
  mod2sparse *pmVar18;
  uint col_00;
  int *extraout_RDX;
  int *extraout_RDX_00;
  mod2sparse *r_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  uint uVar19;
  mod2sparse *pmVar20;
  bool bVar21;
  uint uVar22;
  undefined4 in_register_00000034;
  mod2sparse *pmVar23;
  mod2sparse *pmVar24;
  long lVar25;
  mod2sparse *in_R8;
  ulong uVar26;
  long in_R9;
  ulong uVar27;
  byte bVar28;
  ulong in_R10;
  byte bVar29;
  ulong in_R11;
  uint unaff_R12D;
  mod2entry *pmVar30;
  uint *puVar31;
  uint unaff_R13D;
  mod2entry *pmVar32;
  int iVar33;
  mod2sparse *unaff_R14;
  uint uStack_128;
  int iStack_10c;
  mod2sparse *pmStack_f8;
  mod2entry *pmStack_e8;
  uint uStack_dc;
  void *pvStack_c0;
  
  pmVar23 = (mod2sparse *)CONCAT44(in_register_00000034,col);
  if ((-1 < col) && (col < m->n_cols)) {
    pmVar15 = m->cols[(uint)col].down;
    if (pmVar15->row < 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = 0;
      do {
        iVar5 = iVar5 + 1;
        pmVar15 = pmVar15->down;
      } while (-1 < pmVar15->row);
    }
    return iVar5;
  }
  mod2sparse_count_col_cold_1();
  if (extraout_RDX[1] <= m->n_cols) {
    iVar5 = (int)pmVar23;
    if ((((-1 < iVar5) && (-1 < (int)in_RCX)) && (unaff_R14 = m, iVar5 < m->n_rows)) &&
       ((int)in_RCX < *extraout_RDX)) {
      pmVar15 = m->rows[(ulong)pmVar23 & 0xffffffff].right;
      pmVar9 = *(mod2entry **)(extraout_RDX + 2);
      pmVar30 = pmVar9[(ulong)in_RCX & 0xffffffff].right;
      iVar6 = pmVar15->row;
      do {
        if (iVar6 < 0) {
          for (; -1 < pmVar30->row; pmVar30 = pmVar30->right) {
            pmVar9 = mod2sparse_insert(m,iVar5,pmVar30->col);
          }
          return (int)pmVar9;
        }
        if (pmVar30->row < 0) {
          return (int)pmVar9;
        }
        iVar6 = pmVar30->col;
        if (iVar6 < pmVar15->col) {
          pmVar9 = mod2sparse_insert(m,iVar5,iVar6);
          pmVar32 = pmVar15;
LAB_00122011:
          pmVar30 = pmVar30->right;
        }
        else {
          pmVar32 = pmVar15->right;
          if (pmVar15->col == iVar6) {
            mod2sparse_delete(m,pmVar15);
            pmVar9 = extraout_RAX;
            goto LAB_00122011;
          }
        }
        iVar6 = pmVar32->row;
        pmVar15 = pmVar32;
      } while( true );
    }
    mod2sparse_add_row_cold_1();
  }
  mod2sparse_add_row_cold_2();
  if (*extraout_RDX_00 <= m->n_rows) {
    iVar5 = (int)pmVar23;
    if (((-1 < iVar5) && (-1 < (int)in_RCX)) &&
       ((iVar5 < m->n_cols && ((int)in_RCX < extraout_RDX_00[1])))) {
      pmVar15 = m->cols[(ulong)pmVar23 & 0xffffffff].down;
      puVar31 = *(uint **)(*(long *)(extraout_RDX_00 + 4) + 0x20 +
                          ((ulong)in_RCX & 0xffffffff) * 0x38);
      uVar22 = pmVar15->row;
      do {
        pmVar9 = (mod2entry *)(ulong)uVar22;
        if ((int)uVar22 < 0) {
          while( true ) {
            if ((int)*puVar31 < 0) break;
            pmVar9 = mod2sparse_insert(m,*puVar31,iVar5);
            puVar31 = *(uint **)(puVar31 + 8);
          }
          return (int)pmVar9;
        }
        uVar2 = *puVar31;
        if ((int)uVar2 < 0) {
          return uVar22;
        }
        if (uVar2 < uVar22) {
          mod2sparse_insert(m,uVar2,iVar5);
          pmVar9 = pmVar15;
LAB_001220dc:
          puVar31 = *(uint **)(puVar31 + 8);
        }
        else {
          pmVar9 = pmVar15->down;
          if (uVar22 == uVar2) {
            mod2sparse_delete(m,pmVar15);
            goto LAB_001220dc;
          }
        }
        uVar22 = pmVar9->row;
        pmVar15 = pmVar9;
      } while( true );
    }
    mod2sparse_add_col_cold_1();
  }
  mod2sparse_add_col_cold_2();
  iVar5 = (int)pmVar23;
  pmVar18 = in_RCX;
  if (r_00->n_cols == iVar5) {
    uVar22 = m->n_rows;
    pmVar10 = (mod2sparse *)(ulong)uVar22;
    if (r_00->n_rows != uVar22) goto LAB_001228d2;
    uVar2 = m->n_cols;
    pmVar18 = (mod2sparse *)(ulong)uVar2;
    if ((in_RCX->n_cols != uVar2) || (in_RCX->n_rows != iVar5)) goto LAB_001228d2;
    __ptr = pmVar18;
    pmVar24 = pmVar23;
    if ((int)unaff_R13D <= (int)(uVar2 - iVar5)) {
      pvVar11 = chk_alloc(uVar22,4);
      __ptr = (mod2sparse *)chk_alloc(uVar2,4);
      if (0 < (int)unaff_R13D) {
        pmStack_f8 = (mod2sparse *)chk_alloc(uVar22 + 1,4);
      }
      if (unaff_R12D == 2) {
        pvStack_c0 = chk_alloc(uVar22,4);
      }
      mod2sparse_clear(r_00);
      mod2sparse_clear(in_RCX);
      r = mod2sparse_allocate(uVar22,uVar2);
      pmVar24 = r;
      mod2sparse_copy(m,r);
      if (0 < (int)uVar22 && unaff_R12D == 2) {
        pmVar12 = (mod2sparse *)0x0;
        do {
          pmVar24 = (mod2sparse *)((ulong)pmVar12 & 0xffffffff);
          iVar6 = mod2sparse_count_row(r,(int)pmVar12);
          *(int *)((long)pvStack_c0 + (long)pmVar12 * 4) = iVar6;
          pmVar12 = (mod2sparse *)((long)&pmVar12->n_rows + 1);
        } while (pmVar10 != pmVar12);
      }
      if (0 < (int)uVar22) {
        pmVar12 = (mod2sparse *)0x0;
        do {
          *(int *)((long)pvVar11 + (long)pmVar12 * 4) = (int)pmVar12;
          (&in_R8->n_rows)[(long)pmVar12] = (int)pmVar12;
          pmVar12 = (mod2sparse *)((long)&pmVar12->n_rows + 1);
        } while (pmVar10 != pmVar12);
      }
      if (0 < (int)uVar2) {
        pmVar12 = (mod2sparse *)0x0;
        do {
          (&__ptr->n_rows)[(long)pmVar12] = (int)pmVar12;
          *(int *)(in_R9 + (long)pmVar12 * 4) = (int)pmVar12;
          pmVar12 = (mod2sparse *)((long)&pmVar12->n_rows + 1);
        } while (pmVar18 != pmVar12);
      }
      if (iVar5 < 1) {
        iStack_10c = 0;
LAB_00122830:
        if ((int)uVar22 <= iVar5) {
LAB_00122873:
          mod2sparse_free(r);
          free(pvVar11);
          free(__ptr);
          if (unaff_R12D == 2) {
            free(pvStack_c0);
          }
          if (0 < (int)unaff_R13D) {
            free(pmStack_f8);
          }
          return iStack_10c;
        }
        lVar25 = (long)iVar5;
        do {
          while (pmVar15 = r_00->rows[(&in_R8->n_rows)[lVar25]].right, pmVar15->row < 0) {
            lVar25 = lVar25 + 1;
            if (uVar22 == (uint)lVar25) goto LAB_00122873;
          }
          mod2sparse_delete(r_00,pmVar15);
        } while( true );
      }
      if (unaff_R12D < 3) {
        lVar25 = (long)(int)uVar2;
        pmVar12 = (mod2sparse *)0x0;
        iStack_10c = 0;
        pmVar24 = in_R8;
        do {
          uStack_128 = (uint)in_R10;
          uVar19 = (uint)pmVar12;
          if (unaff_R12D == 0) {
            pmVar20 = pmVar12;
            if ((long)pmVar12 < lVar25) {
              pmVar24 = pmVar12;
              do {
                for (pmStack_e8 = r->cols[*(int *)(in_R9 + (long)pmVar24 * 4)].down;
                    -1 < pmStack_e8->row; pmStack_e8 = pmStack_e8->down) {
                  if ((long)pmVar12 <=
                      (long)*(int *)((long)pvVar11 + (ulong)(uint)pmStack_e8->row * 4))
                  goto LAB_00122529;
                }
                pmVar24 = (mod2sparse *)((long)&pmVar24->n_rows + 1);
                pmVar20 = pmVar18;
              } while (pmVar24 != pmVar18);
            }
            pmVar24 = (mod2sparse *)((ulong)pmVar20 & 0xffffffff);
LAB_00122598:
            iStack_10c = iStack_10c + 1;
            uVar26 = in_R11;
          }
          else {
            if (unaff_R12D != 1) {
              if ((long)pmVar12 < lVar25) {
                bVar21 = false;
                pmVar20 = pmVar12;
                do {
                  in_R11 = in_R11 & 0xffffffff;
                  iVar6 = mod2sparse_count_col(r,*(int *)(in_R9 + (long)pmVar20 * 4));
                  pmVar15 = r->cols[*(int *)(in_R9 + (long)pmVar20 * 4)].down;
                  uVar7 = pmVar15->row;
                  if (-1 < (int)uVar7) {
                    do {
                      if ((long)pmVar12 <= (long)*(int *)((long)pvVar11 + (ulong)uVar7 * 4)) {
                        uVar7 = (*(int *)((long)pvStack_c0 + (ulong)uVar7 * 4) + -1) * (iVar6 + -1);
                        bVar4 = !bVar21;
                        bVar21 = true;
                        if (((bVar4) || (iVar6 == 1)) || ((int)uVar7 < (int)in_R11)) {
                          if (iVar6 == 1) {
                            uVar7 = 0;
                          }
                          pmVar24 = (mod2sparse *)((ulong)pmVar20 & 0xffffffff);
                          in_R11 = (ulong)uVar7;
                          pmStack_e8 = pmVar15;
                        }
                      }
                      pmVar15 = pmVar15->down;
                      uVar7 = pmVar15->row;
                    } while (-1 < (int)uVar7);
                  }
                  pmVar20 = (mod2sparse *)((long)&pmVar20->n_rows + 1);
                } while (pmVar20 != pmVar18);
                goto LAB_00122508;
              }
              goto LAB_00122598;
            }
            if (lVar25 <= (long)pmVar12) goto LAB_00122598;
            bVar21 = false;
            pmVar20 = pmVar12;
            do {
              in_R11 = in_R11 & 0xffffffff;
              uVar7 = mod2sparse_count_col(r,*(int *)(in_R9 + (long)pmVar20 * 4));
              if ((bVar21) && ((int)uStack_128 <= (int)uVar7)) {
                bVar21 = true;
              }
              else {
                pmVar15 = r->cols[*(int *)(in_R9 + (long)pmVar20 * 4)].down;
                uVar3 = pmVar15->row;
                while (-1 < (int)uVar3) {
                  if ((long)pmVar12 <= (long)*(int *)((long)pvVar11 + (ulong)uVar3 * 4)) {
                    pmVar24 = (mod2sparse *)((ulong)pmVar20 & 0xffffffff);
                    bVar21 = true;
                    uStack_128 = uVar7;
                    pmStack_e8 = pmVar15;
                    break;
                  }
                  pmVar15 = pmVar15->down;
                  uVar3 = pmVar15->row;
                }
              }
              pmVar20 = (mod2sparse *)((long)&pmVar20->n_rows + 1);
            } while (pmVar20 != pmVar18);
LAB_00122508:
            if (!bVar21) goto LAB_00122598;
LAB_00122529:
            iVar6 = (int)pmVar24;
            if ((&__ptr->n_rows)[pmStack_e8->col] != iVar6) goto LAB_001228cd;
            *(undefined4 *)(in_R9 + (long)iVar6 * 4) = *(undefined4 *)(in_R9 + (long)pmVar12 * 4);
            *(int *)(in_R9 + (long)pmVar12 * 4) = pmStack_e8->col;
            (&__ptr->n_rows)[*(int *)(in_R9 + (long)iVar6 * 4)] = iVar6;
            (&__ptr->n_rows)[*(int *)(in_R9 + (long)pmVar12 * 4)] = uVar19;
            uVar7 = *(uint *)((long)pvVar11 + (long)pmStack_e8->row * 4);
            pmVar24 = (mod2sparse *)(ulong)uVar7;
            lVar13 = (long)(int)uVar7;
            if (lVar13 < (long)pmVar12) goto LAB_001228cd;
            (&in_R8->n_rows)[lVar13] = (&in_R8->n_rows)[(long)pmVar12];
            (&in_R8->n_rows)[(long)pmVar12] = pmStack_e8->row;
            *(uint *)((long)pvVar11 + (long)(&in_R8->n_rows)[lVar13] * 4) = uVar7;
            *(uint *)((long)pvVar11 + (long)(&in_R8->n_rows)[(long)pmVar12] * 4) = uVar19;
            uVar26 = in_R11;
          }
          pmVar15 = r->cols[*(int *)(in_R9 + (long)pmVar12 * 4)].down;
          uVar7 = pmVar15->row;
          in_R11 = uVar26;
          if (-1 < (int)uVar7) {
            do {
              pmVar24 = (mod2sparse *)(ulong)uVar7;
              pmVar15 = pmVar15->down;
              uVar3 = *(uint *)((long)pvVar11 + (ulong)uVar7 * 4);
              if ((long)pmVar12 < (long)(int)uVar3) {
                mod2sparse_add_row(r,uVar7,r,pmStack_e8->row);
                pmVar20 = r_00;
                col_00 = uVar19;
                if (unaff_R12D == 2) {
                  iVar6 = mod2sparse_count_row(r,uVar7);
                  *(int *)((long)pvStack_c0 + (ulong)uVar7 * 4) = iVar6;
                }
              }
              else {
                pmVar20 = in_RCX;
                if ((long)(int)uVar3 < (long)pmVar12) {
                  col_00 = *(uint *)(in_R9 + (long)pmVar12 * 4);
                  uVar7 = uVar3;
                }
                else {
                  mod2sparse_insert(r_00,uVar7,uVar19);
                  col_00 = *(uint *)(in_R9 + (long)pmVar12 * 4);
                  uVar7 = uVar19;
                }
              }
              mod2sparse_insert(pmVar20,uVar7,col_00);
              uVar7 = pmVar15->row;
            } while (-1 < (int)uVar7);
            pmVar15 = r->cols;
            while (-1 < (pmVar15[*(int *)(in_R9 + (long)pmVar12 * 4)].down)->row) {
              mod2sparse_delete(r,pmVar15[*(int *)(in_R9 + (long)pmVar12 * 4)].down);
              pmVar15 = r->cols;
            }
            in_R11 = uVar26 & 0xffffffff;
          }
          if (pmVar12 == (mod2sparse *)((ulong)unaff_R14 & 0xffffffff) && 0 < (int)unaff_R13D) {
            if (-1 < (int)uVar22) {
              memset(pmStack_f8,0,(ulong)(uVar22 + 1) << 2);
            }
            lVar13 = (long)(int)uVar22 + 1;
            pmVar24 = pmVar10;
            uStack_128 = unaff_R13D;
            if (0 < (int)uVar2) {
              uVar19 = 0;
              do {
                iVar6 = mod2sparse_count_col(r,uVar19);
                (&pmStack_f8->n_rows)[iVar6] = (&pmStack_f8->n_rows)[iVar6] + 1;
                uVar19 = uVar19 + 1;
              } while (uVar2 != uVar19);
            }
            while( true ) {
              iVar6 = *(int *)((long)pmStack_f8 + lVar13 * 4 + -4);
              uVar19 = uStack_128 - iVar6;
              iVar33 = (int)pmVar24;
              if (uVar19 == 0 || (int)uStack_128 < iVar6) break;
              lVar14 = lVar13 + -1;
              bVar21 = lVar13 < 1;
              lVar13 = lVar14;
              pmVar24 = (mod2sparse *)(ulong)(iVar33 - 1);
              uStack_128 = uVar19;
              if (lVar14 == 0 || bVar21) goto LAB_001228cd;
            }
            if ((int)uVar2 < 1) {
              uStack_dc = 0;
            }
            else {
              pmVar20 = (mod2sparse *)0x0;
              uStack_dc = 0;
              do {
                iVar6 = mod2sparse_count_col(r,(int)pmVar20);
                if ((iVar33 < iVar6) || ((iVar6 == iVar33 && (0 < (int)uStack_128)))) {
                  pmVar15 = r->cols;
                  while (-1 < (pmVar15[(long)pmVar20].down)->row) {
                    mod2sparse_delete(r,pmVar15[(long)pmVar20].down);
                    pmVar15 = r->cols;
                  }
                  uStack_128 = uStack_128 - (iVar6 == iVar33);
                  uStack_dc = uStack_dc + 1;
                }
                pmVar20 = (mod2sparse *)((long)&pmVar20->n_rows + 1);
              } while (pmVar20 != pmVar18);
            }
            if (uStack_dc != unaff_R13D) {
LAB_001228cd:
              abort();
            }
            if (0 < (int)uVar22 && unaff_R12D == 2) {
              pmVar20 = (mod2sparse *)0x0;
              do {
                iVar6 = mod2sparse_count_row(r,(int)pmVar20);
                *(int *)((long)pvStack_c0 + (long)pmVar20 * 4) = iVar6;
                pmVar20 = (mod2sparse *)((long)&pmVar20->n_rows + 1);
              } while (pmVar10 != pmVar20);
            }
            in_R11 = uVar26 & 0xffffffff;
          }
          pmVar12 = (mod2sparse *)((long)&pmVar12->n_rows + 1);
          in_R10 = (ulong)uStack_128;
        } while (pmVar12 != (mod2sparse *)((ulong)pmVar23 & 0xffffffff));
        goto LAB_00122830;
      }
      goto LAB_001228dc;
    }
  }
  else {
LAB_001228d2:
    mod2sparse_decomp_cold_1();
    __ptr = pmVar18;
    pmVar24 = pmVar23;
  }
  pmStack_f8 = m;
  mod2sparse_decomp_cold_3();
LAB_001228dc:
  mod2sparse_decomp_cold_2();
  uVar26 = (ulong)pmStack_f8->n_cols;
  if (0 < (long)uVar26) {
    uVar27 = 0;
    do {
      if (pmVar24 == (mod2sparse *)0x0) {
        iVar5 = (int)uVar27;
      }
      else {
        iVar5 = (&pmVar24->n_rows)[uVar27];
      }
      pmVar15 = pmStack_f8->rows[iVar5].left;
      if ((-1 < pmVar15->row) && ((long)uVar27 < (long)pmVar15->col)) {
        mod2sparse_forward_sub_cold_1();
        lVar25 = (long)pmStack_f8->n_rows;
        if (0 < lVar25) {
          lVar13 = 0;
          do {
            if (pmVar24 == (mod2sparse *)0x0) {
              iVar5 = (int)lVar13;
            }
            else {
              iVar5 = (&pmVar24->n_rows)[lVar13];
            }
            if (lVar13 < (pmStack_f8->cols[iVar5].up)->row) {
              mod2sparse_backward_sub_cold_1();
              if (((char)pmStack_f8->n_rows != '-') ||
                 (*(char *)((long)&pmStack_f8->n_rows + 1) != '\0')) {
                pFVar8 = fopen((char *)pmStack_f8,(char *)pmVar24);
                return (int)pFVar8;
              }
              cVar1 = (char)pmVar24->n_rows;
              if (cVar1 == 'w') {
                puVar16 = (undefined8 *)&stdout;
              }
              else {
                if (cVar1 != 'r') {
                  pmVar23 = pmVar24;
                  open_file_std_cold_1();
                  iVar5 = (int)pmVar23;
                  if ((0 < iVar5) && (uVar22 = (uint)pmVar24, 0 < (int)uVar22)) {
                    piVar17 = (int *)chk_alloc(1,0x20);
                    *piVar17 = iVar5;
                    piVar17[1] = uVar22;
                    piVar17[2] = iVar5 + 0x1fU >> 5;
                    pvVar11 = chk_alloc(uVar22,8);
                    *(void **)(piVar17 + 4) = pvVar11;
                    pvVar11 = chk_alloc(piVar17[1] * piVar17[2],4);
                    *(void **)(piVar17 + 6) = pvVar11;
                    iVar5 = piVar17[1];
                    if (0 < (long)iVar5) {
                      iVar6 = piVar17[2];
                      lVar25 = 0;
                      lVar13 = 0;
                      do {
                        *(long *)(*(long *)(piVar17 + 4) + lVar13 * 8) =
                             *(long *)(piVar17 + 6) + lVar25;
                        lVar13 = lVar13 + 1;
                        lVar25 = lVar25 + (long)iVar6 * 4;
                      } while (iVar5 != lVar13);
                    }
                    return (int)piVar17;
                  }
                  mod2dense_allocate_cold_1();
                  free(pmVar23->blocks);
                  free(pmVar23->cols);
                  free(pmVar23);
                  return extraout_EAX;
                }
                puVar16 = (undefined8 *)&stdin;
              }
              return (int)*puVar16;
            }
            lVar13 = lVar13 + 1;
          } while (lVar25 != lVar13);
          if (0 < pmStack_f8->n_rows) {
            do {
              lVar13 = lVar25 + -1;
              if (pmVar24 == (mod2sparse *)0x0) {
                iVar5 = (int)lVar13;
              }
              else {
                iVar5 = *(int *)((long)pmVar24 + lVar13 * 4);
              }
              pmVar15 = pmStack_f8->rows[lVar13].right;
              bVar28 = 0;
              if (pmVar15->row < 0) {
LAB_00122a7e:
                bVar29 = *(byte *)(extraout_RDX_02 + lVar13);
                if (bVar28 != bVar29) {
                  return 0;
                }
              }
              else {
                bVar28 = 0;
                bVar21 = true;
                do {
                  while (pmVar15->col != iVar5) {
                    bVar28 = bVar28 ^ *(byte *)((long)&__ptr->n_rows + (long)pmVar15->col);
                    pmVar15 = pmVar15->right;
                    if (pmVar15->row < 0) {
                      if (bVar21) goto LAB_00122a7e;
                      goto LAB_00122a8a;
                    }
                  }
                  pmVar15 = pmVar15->right;
                  bVar21 = false;
                } while (-1 < pmVar15->row);
LAB_00122a8a:
                bVar29 = *(byte *)(extraout_RDX_02 + lVar13);
              }
              *(byte *)((long)&__ptr->n_rows + (long)iVar5) = bVar28 ^ bVar29;
              bVar21 = 1 < lVar25;
              lVar25 = lVar13;
            } while (bVar21);
          }
        }
        return 1;
      }
      uVar27 = uVar27 + 1;
    } while (uVar26 != uVar27);
    if (0 < pmStack_f8->n_cols) {
      uVar27 = 0;
      do {
        if (pmVar24 == (mod2sparse *)0x0) {
          iVar5 = (int)uVar27;
        }
        else {
          iVar5 = (&pmVar24->n_rows)[uVar27];
        }
        lVar25 = (long)iVar5;
        pmVar15 = pmStack_f8->rows[lVar25].right;
        bVar28 = 0;
        if (pmVar15->row < 0) {
LAB_0012299d:
          bVar29 = *(byte *)(extraout_RDX_01 + lVar25);
          if (bVar28 != bVar29) {
            return 0;
          }
        }
        else {
          bVar28 = 0;
          bVar21 = true;
          do {
            while (uVar27 != (uint)pmVar15->col) {
              bVar28 = bVar28 ^ *(byte *)((long)&__ptr->n_rows + (long)pmVar15->col);
              pmVar15 = pmVar15->right;
              if (pmVar15->row < 0) {
                if (bVar21) goto LAB_0012299d;
                goto LAB_001229a9;
              }
            }
            pmVar15 = pmVar15->right;
            bVar21 = false;
          } while (-1 < pmVar15->row);
LAB_001229a9:
          bVar29 = *(byte *)(extraout_RDX_01 + lVar25);
        }
        *(byte *)((long)&__ptr->n_rows + uVar27) = bVar28 ^ bVar29;
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar26);
    }
  }
  return 1;
}

Assistant:

int mod2sparse_count_col
( mod2sparse *m,
  int col
)
{
  mod2entry *e;
  int count;

  if (col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_count_col: column index out of bounds\n");
    exit(1);
  }

  count = 0;

  for (e = mod2sparse_first_in_col(m,col);
       !mod2sparse_at_end(e);
       e = mod2sparse_next_in_col(e))
  { count += 1;
  }

  return count;
}